

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O1

void __thiscall TestRunner::RunAll(TestRunner *this,TestSuite *ts)

{
  TestCase *pTVar1;
  bool bVar2;
  long lVar3;
  
  if (0 < (int)(ts->mTestCases).mSize) {
    lVar3 = 0;
    do {
      bVar2 = TestCase::Start((ts->mTestCases).mData[lVar3]);
      if (!bVar2) {
        exit(1);
      }
      pTVar1 = (ts->mTestCases).mData[lVar3];
      if (pTVar1 != (TestCase *)0x0) {
        (*pTVar1->_vptr_TestCase[1])();
      }
      (ts->mTestCases).mData[lVar3] = (TestCase *)0x0;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (int)(ts->mTestCases).mSize);
  }
  return;
}

Assistant:

void RunAll( TestSuite &ts )
	{
		for( int i = 0; i < (int)ts.mTestCases.size(); i++ )
		{
			LOG_NOTICE( "Running test %s", ts.mTestCases[ i ]->GetTestName() );
			if ( ts.mTestCases[ i ]->Start() == false )
			{
				exit( EXIT_FAILURE );
			}
			delete ts.mTestCases[ i ];
			ts.mTestCases[ i ] = NULL;
		}
	}